

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_unsigned_long_&>::
reconstructExpression
          (BinaryExpression<const_int_&,_(Catch::Internal::Operator)0,_const_unsigned_long_&> *this,
          string *dest)

{
  long lVar1;
  int in_EDX;
  unsigned_long value;
  string rhs;
  string lhs;
  string local_58;
  string local_38;
  
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)(uint)*this->m_lhs,in_EDX);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)*this->m_rhs,value);
  if ((local_58._M_string_length + local_38._M_string_length < 0x28) &&
     (lVar1 = std::__cxx11::string::find((char)&local_38,10), lVar1 == -1)) {
    std::__cxx11::string::find((char)&local_58,10);
  }
  std::__cxx11::string::reserve((ulong)dest);
  std::__cxx11::string::_M_assign((string *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::append((char *)dest);
  std::__cxx11::string::push_back((char)dest);
  std::__cxx11::string::_M_append((char *)dest,(ulong)local_58._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

virtual void reconstructExpression( std::string& dest ) const CATCH_OVERRIDE {
        std::string lhs = Catch::toString( m_lhs );
        std::string rhs = Catch::toString( m_rhs );
        char delim = lhs.size() + rhs.size() < 40 &&
                     lhs.find('\n') == std::string::npos &&
                     rhs.find('\n') == std::string::npos ? ' ' : '\n';
        dest.reserve( 7 + lhs.size() + rhs.size() );
                   // 2 for spaces around operator
                   // 2 for operator
                   // 2 for parentheses (conditionally added later)
                   // 1 for negation (conditionally added later)
        dest = lhs;
        dest += delim;
        dest += Internal::OperatorTraits<Op>::getName();
        dest += delim;
        dest += rhs;
    }